

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::TableBeginApplyRequests(ImGuiTable *table)

{
  char *pcVar1;
  float width;
  char cVar2;
  char cVar3;
  char cVar4;
  ImGuiTableColumn *pIVar5;
  int iVar6;
  ImGuiTableColumn *pIVar7;
  long lVar8;
  long lVar9;
  char *pcVar10;
  ImGuiTableColumnIdx *pIVar11;
  ImGuiTableColumn *pIVar12;
  ImGuiTableColumn *pIVar13;
  long lVar14;
  
  if (table->InstanceCurrent == 0) {
    if (table->ResizedColumn != -1) {
      width = table->ResizedColumnNextWidth;
      if ((width != 3.4028235e+38) || (NAN(width))) {
        TableSetColumnWidth((int)table->ResizedColumn,width);
      }
    }
    table->LastResizedColumn = table->ResizedColumn;
    table->ResizedColumnNextWidth = 3.4028235e+38;
    table->ResizedColumn = -1;
    cVar2 = table->AutoFitSingleColumn;
    if ((long)cVar2 == -1) goto LAB_0015bcd5;
    if ((-1 < cVar2) && (pIVar7 = (table->Columns).Data + cVar2, pIVar7 < (table->Columns).DataEnd))
    {
      TableSetColumnWidth((int)cVar2,pIVar7->WidthAuto);
      table->AutoFitSingleColumn = -1;
      goto LAB_0015bcd5;
    }
  }
  else {
LAB_0015bcd5:
    if (table->InstanceCurrent != 0) {
LAB_0015bcdc:
      if (table->IsResetDisplayOrderRequest == true) {
        if (0 < table->ColumnsCount) {
          lVar8 = 0;
          lVar9 = 0;
          do {
            pIVar7 = (table->Columns).Data;
            if ((table->Columns).DataEnd <= (ImGuiTableColumn *)((long)&pIVar7->Flags + lVar8))
            goto LAB_0015be97;
            (&pIVar7->DisplayOrder)[lVar8] = (ImGuiTableColumnIdx)lVar9;
            pIVar11 = (table->DisplayOrderToIndex).Data + lVar9;
            if ((table->DisplayOrderToIndex).DataEnd <= pIVar11) goto LAB_0015beae;
            *pIVar11 = (ImGuiTableColumnIdx)lVar9;
            lVar9 = lVar9 + 1;
            lVar8 = lVar8 + 0x68;
          } while (lVar9 < table->ColumnsCount);
        }
        table->IsResetDisplayOrderRequest = false;
        table->IsSettingsDirty = true;
      }
      return;
    }
    if ((table->HeldHeaderColumn == -1) && (table->ReorderColumn != -1)) {
      table->ReorderColumn = -1;
    }
    table->HeldHeaderColumn = -1;
    cVar2 = table->ReorderColumn;
    if ((long)cVar2 == -1) goto LAB_0015bcdc;
    cVar3 = table->ReorderColumnDir;
    iVar6 = (int)cVar3;
    if (iVar6 == 0) goto LAB_0015bcdc;
    if ((cVar3 != '\x01') && (cVar3 != -1)) {
      __assert_fail("reorder_dir == -1 || reorder_dir == +1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O1/_deps/imgui-src/imgui_tables.cpp"
                    ,0x24d,"void ImGui::TableBeginApplyRequests(ImGuiTable *)");
    }
    if ((table->Flags & 2) == 0) {
      __assert_fail("table->Flags & ImGuiTableFlags_Reorderable",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O1/_deps/imgui-src/imgui_tables.cpp"
                    ,0x24e,"void ImGui::TableBeginApplyRequests(ImGuiTable *)");
    }
    if (-1 < cVar2) {
      pIVar7 = (table->Columns).Data;
      pIVar5 = (table->Columns).DataEnd;
      pIVar13 = pIVar7 + cVar2;
      if (((pIVar13 < pIVar5) &&
          (lVar8 = (long)*(char *)((long)&pIVar13->Flags + ((ulong)(cVar3 == -1) ^ 0x55)),
          -1 < lVar8)) && (pIVar12 = pIVar7 + lVar8, pIVar12 < pIVar5)) {
        cVar2 = pIVar13->DisplayOrder;
        lVar8 = (long)cVar2;
        cVar4 = pIVar12->DisplayOrder;
        pIVar13->DisplayOrder = cVar4;
        if (cVar2 != cVar4) {
          pcVar10 = (table->DisplayOrderToIndex).Data;
          lVar9 = lVar8;
          do {
            lVar9 = lVar9 + iVar6;
            if ((lVar9 < 0) ||
               (pcVar1 = pcVar10 + lVar9, (table->DisplayOrderToIndex).DataEnd <= pcVar1))
            goto LAB_0015beae;
            lVar14 = (long)*pcVar1;
            if ((lVar14 < 0) || ((table->Columns).DataEnd <= pIVar7 + lVar14)) goto LAB_0015be97;
            pIVar11 = &pIVar7[lVar14].DisplayOrder;
            *pIVar11 = *pIVar11 - cVar3;
            lVar8 = lVar8 + iVar6;
          } while ((int)lVar8 != (int)cVar4);
        }
        if (cVar4 - iVar6 != (int)pIVar12->DisplayOrder) {
          __assert_fail("dst_column->DisplayOrder == dst_order - reorder_dir",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O1/_deps/imgui-src/imgui_tables.cpp"
                        ,599,"void ImGui::TableBeginApplyRequests(ImGuiTable *)");
        }
        if (0 < table->ColumnsCount) {
          lVar8 = 0;
          lVar9 = 0;
          do {
            pIVar7 = (table->Columns).Data;
            if ((table->Columns).DataEnd <= (ImGuiTableColumn *)((long)&pIVar7->Flags + lVar8))
            goto LAB_0015be97;
            lVar14 = (long)(&pIVar7->DisplayOrder)[lVar8];
            if ((lVar14 < 0) ||
               (pcVar10 = (table->DisplayOrderToIndex).Data + lVar14,
               (table->DisplayOrderToIndex).DataEnd <= pcVar10)) goto LAB_0015beae;
            *pcVar10 = (char)lVar9;
            lVar9 = lVar9 + 1;
            lVar8 = lVar8 + 0x68;
          } while (lVar9 < table->ColumnsCount);
        }
        table->ReorderColumnDir = '\0';
        table->IsSettingsDirty = true;
        goto LAB_0015bcdc;
      }
    }
  }
LAB_0015be97:
  pcVar10 = "T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]";
LAB_0015bec3:
  __assert_fail("p >= Data && p < DataEnd",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O1/_deps/imgui-src/imgui_internal.h"
                ,0x20e,pcVar10);
LAB_0015beae:
  pcVar10 = "T &ImSpan<signed char>::operator[](int) [T = signed char]";
  goto LAB_0015bec3;
}

Assistant:

void ImGui::TableBeginApplyRequests(ImGuiTable* table)
{
    // Handle resizing request
    // (We process this at the first TableBegin of the frame)
    // FIXME-TABLE: Contains columns if our work area doesn't allow for scrolling?
    if (table->InstanceCurrent == 0)
    {
        if (table->ResizedColumn != -1 && table->ResizedColumnNextWidth != FLT_MAX)
            TableSetColumnWidth(table->ResizedColumn, table->ResizedColumnNextWidth);
        table->LastResizedColumn = table->ResizedColumn;
        table->ResizedColumnNextWidth = FLT_MAX;
        table->ResizedColumn = -1;

        // Process auto-fit for single column, which is a special case for stretch columns and fixed columns with FixedSame policy.
        // FIXME-TABLE: Would be nice to redistribute available stretch space accordingly to other weights, instead of giving it all to siblings.
        if (table->AutoFitSingleColumn != -1)
        {
            TableSetColumnWidth(table->AutoFitSingleColumn, table->Columns[table->AutoFitSingleColumn].WidthAuto);
            table->AutoFitSingleColumn = -1;
        }
    }

    // Handle reordering request
    // Note: we don't clear ReorderColumn after handling the request.
    if (table->InstanceCurrent == 0)
    {
        if (table->HeldHeaderColumn == -1 && table->ReorderColumn != -1)
            table->ReorderColumn = -1;
        table->HeldHeaderColumn = -1;
        if (table->ReorderColumn != -1 && table->ReorderColumnDir != 0)
        {
            // We need to handle reordering across hidden columns.
            // In the configuration below, moving C to the right of E will lead to:
            //    ... C [D] E  --->  ... [D] E  C   (Column name/index)
            //    ... 2  3  4        ...  2  3  4   (Display order)
            const int reorder_dir = table->ReorderColumnDir;
            IM_ASSERT(reorder_dir == -1 || reorder_dir == +1);
            IM_ASSERT(table->Flags & ImGuiTableFlags_Reorderable);
            ImGuiTableColumn* src_column = &table->Columns[table->ReorderColumn];
            ImGuiTableColumn* dst_column = &table->Columns[(reorder_dir == -1) ? src_column->PrevEnabledColumn : src_column->NextEnabledColumn];
            IM_UNUSED(dst_column);
            const int src_order = src_column->DisplayOrder;
            const int dst_order = dst_column->DisplayOrder;
            src_column->DisplayOrder = (ImGuiTableColumnIdx)dst_order;
            for (int order_n = src_order + reorder_dir; order_n != dst_order + reorder_dir; order_n += reorder_dir)
                table->Columns[table->DisplayOrderToIndex[order_n]].DisplayOrder -= (ImGuiTableColumnIdx)reorder_dir;
            IM_ASSERT(dst_column->DisplayOrder == dst_order - reorder_dir);

            // Display order is stored in both columns->IndexDisplayOrder and table->DisplayOrder[],
            // rebuild the later from the former.
            for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                table->DisplayOrderToIndex[table->Columns[column_n].DisplayOrder] = (ImGuiTableColumnIdx)column_n;
            table->ReorderColumnDir = 0;
            table->IsSettingsDirty = true;
        }
    }

    // Handle display order reset request
    if (table->IsResetDisplayOrderRequest)
    {
        for (int n = 0; n < table->ColumnsCount; n++)
            table->DisplayOrderToIndex[n] = table->Columns[n].DisplayOrder = (ImGuiTableColumnIdx)n;
        table->IsResetDisplayOrderRequest = false;
        table->IsSettingsDirty = true;
    }
}